

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgsrfs.c
# Opt level: O1

void cgsrfs(trans_t trans,SuperMatrix *A,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,
           char *equed,float *R,float *C,SuperMatrix *B,SuperMatrix *X,float *ferr,float *berr,
           SuperLUStat_t *stat,int *info)

{
  singlecomplex *x;
  float *est;
  float fVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  SuperMatrix *pSVar10;
  int *perm_r_00;
  singlecomplex *psVar11;
  int iVar12;
  singlecomplex *cy;
  void *pvVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  int local_238;
  byte local_233;
  char local_232;
  char transc [1];
  int nrow;
  int ione;
  double local_1f0;
  trans_t local_1e4;
  float local_1e0;
  int kase;
  ulong local_1d8;
  float local_1cc;
  int *local_1c8;
  void *local_1c0;
  SuperMatrix *local_1b8;
  int *local_1b0;
  SuperMatrix *local_1a8;
  int *local_1a0;
  double local_198;
  long local_190;
  long local_188;
  singlecomplex *local_180;
  singlecomplex done;
  SuperMatrix Bjcol;
  int isave [3];
  
  ione = 1;
  nrow = A->nrow;
  done.r = 1.0;
  done.i = 0.0;
  pvVar7 = A->Store;
  local_190 = *(long *)((long)pvVar7 + 8);
  lVar8 = *(long *)((long)B->Store + 8);
  lVar9 = *(long *)((long)X->Store + 8);
  iVar3 = *B->Store;
  iVar4 = *X->Store;
  local_188 = (long)iVar4;
  uVar5 = B->ncol;
  *info = 0;
  local_233 = trans != NOTRANS;
  iVar12 = -1;
  if (trans < (CONJ|TRANS)) {
    iVar6 = A->nrow;
    iVar12 = -2;
    if ((((iVar6 < 0) || (iVar6 != A->ncol)) || (A->Stype != SLU_NC)) ||
       ((A->Dtype != SLU_C || (A->Mtype != SLU_GE)))) goto LAB_00104788;
    iVar12 = -3;
    if (((L->nrow < 0) || ((L->nrow != L->ncol || (L->Stype != SLU_SC)))) ||
       ((L->Dtype != SLU_C || (L->Mtype != SLU_TRLU)))) goto LAB_00104788;
    iVar12 = -4;
    if ((((U->nrow < 0) || (U->nrow != U->ncol)) || (U->Stype != SLU_NC)) ||
       ((U->Dtype != SLU_C || (U->Mtype != SLU_TRU)))) goto LAB_00104788;
    iVar12 = -10;
    if (((iVar3 < iVar6) || ((B->Stype != SLU_DN || (B->Dtype != SLU_C)))) ||
       (iVar12 = -10, B->Mtype != SLU_GE)) goto LAB_00104788;
    iVar12 = -0xb;
    if ((((iVar4 < iVar6) || (X->Stype != SLU_DN)) || (X->Dtype != SLU_C)) ||
       (iVar12 = -0xb, X->Mtype != SLU_GE)) goto LAB_00104788;
  }
  else {
LAB_00104788:
    *info = iVar12;
  }
  local_1b8 = U;
  local_1b0 = perm_r;
  local_1a0 = perm_c;
  if (*info != 0) {
    local_238 = -*info;
    input_error("cgsrfs",&local_238);
    return;
  }
  if (uVar5 == 0 || (long)A->nrow == 0) {
    if ((int)uVar5 < 1) {
      return;
    }
    uVar17 = 0;
    do {
      ferr[uVar17] = 0.0;
      berr[uVar17] = 0.0;
      uVar17 = uVar17 + 1;
    } while (uVar5 != uVar17);
    return;
  }
  bVar2 = *equed;
  local_1a8 = L;
  cy = singlecomplexMalloc((long)A->nrow * 2);
  pvVar13 = superlu_malloc((long)A->nrow << 2);
  piVar14 = int32Malloc(A->nrow);
  local_1c8 = piVar14;
  if ((pvVar13 == (void *)0x0 || cy == (singlecomplex *)0x0) || piVar14 == (int *)0x0) {
    sprintf((char *)isave,"%s at line %d in file %s\n","Malloc fails for work/rwork/iwork.",0xe3,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgsrfs.c");
    piVar14 = local_1c8;
    superlu_abort_and_exit((char *)isave);
  }
  if (trans == NOTRANS) {
    transc[0] = 'N';
    local_1e4 = TRANS;
  }
  else {
    if (trans == CONJ) {
      transc[0] = 'C';
    }
    else {
      if (trans != TRANS) goto LAB_001048c7;
      transc[0] = 'T';
    }
    local_1e4 = NOTRANS;
  }
LAB_001048c7:
  iVar4 = A->ncol;
  local_1e0 = smach("Epsilon");
  fVar19 = smach("Safe minimum");
  local_238 = 0;
  if (0 < A->nrow) {
    do {
      piVar14[local_238] = 0;
      local_238 = local_238 + 1;
    } while (local_238 < A->nrow);
  }
  if (trans == NOTRANS) {
    if (0 < A->ncol) {
      lVar15 = *(long *)((long)pvVar7 + 0x18);
      lVar16 = 0;
      do {
        local_238 = *(int *)(lVar15 + lVar16 * 4);
        lVar18 = lVar16 + 1;
        if (local_238 < *(int *)(lVar15 + 4 + lVar16 * 4)) {
          lVar16 = *(long *)((long)pvVar7 + 0x10);
          do {
            piVar14[*(int *)(lVar16 + (long)local_238 * 4)] =
                 piVar14[*(int *)(lVar16 + (long)local_238 * 4)] + 1;
            local_238 = local_238 + 1;
          } while (local_238 < *(int *)(lVar15 + lVar18 * 4));
        }
        lVar16 = lVar18;
      } while (lVar18 < A->ncol);
    }
  }
  else if (0 < A->ncol) {
    lVar16 = *(long *)((long)pvVar7 + 0x18);
    lVar15 = 0;
    do {
      piVar14[lVar15] = *(int *)(lVar16 + 4 + lVar15 * 4) - *(int *)(lVar16 + lVar15 * 4);
      lVar15 = lVar15 + 1;
    } while (lVar15 < A->ncol);
  }
  Bjcol.Stype = B->Stype;
  Bjcol.Dtype = B->Dtype;
  Bjcol.Mtype = B->Mtype;
  Bjcol.nrow = B->nrow;
  Bjcol.ncol = 1;
  Bjcol.Store = superlu_malloc(0x10);
  if (Bjcol.Store == (void *)0x0) {
    sprintf((char *)isave,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for Bjcol.Store",0x10c,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgsrfs.c");
    piVar14 = local_1c8;
    superlu_abort_and_exit((char *)isave);
  }
  *(int *)Bjcol.Store = iVar3;
  *(singlecomplex **)((long)Bjcol.Store + 8) = cy;
  if ((int)uVar5 < 1) {
LAB_00105684:
    superlu_free(cy);
    superlu_free(pvVar13);
    superlu_free(piVar14);
    superlu_free(Bjcol.Store);
    return;
  }
  fVar19 = fVar19 * (float)(iVar4 + 1);
  local_198 = (double)fVar19;
  fVar19 = fVar19 / local_1e0;
  local_232 = trans == NOTRANS && (bVar2 & 0xfe) == 0x42;
  local_233 = local_233 & (bVar2 & 0xef) == 0x42;
  uVar17 = 0;
  local_1c0 = pvVar13;
LAB_00104ab9:
  local_180 = (singlecomplex *)(lVar8 + uVar17 * (long)iVar3 * 8);
  x = (singlecomplex *)(lVar9 + uVar17 * local_188 * 8);
  local_1cc = 3.0;
  local_1f0 = (double)((ulong)local_1f0 & 0xffffffff00000000);
  local_1d8 = uVar17;
  do {
    psVar11 = local_180;
    ccopy_(&nrow,local_180,&ione,cy,&ione);
    sp_cgemv(transc,(singlecomplex)0xbf800000,A,x,ione,done,cy,ione);
    local_238 = 0;
    if (0 < A->nrow) {
      do {
        dVar21 = c_abs1(psVar11 + local_238);
        *(float *)((long)pvVar13 + (long)local_238 * 4) = (float)dVar21;
        local_238 = local_238 + 1;
      } while (local_238 < A->nrow);
    }
    if (trans == NOTRANS) {
      if (0 < A->ncol) {
        lVar15 = 0;
        do {
          dVar21 = c_abs1(x + lVar15);
          lVar16 = local_190;
          local_238 = *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar15 * 4);
          lVar18 = lVar15 + 1;
          if (local_238 < *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar15 * 4)) {
            do {
              dVar22 = c_abs1((singlecomplex *)(lVar16 + (long)local_238 * 8));
              lVar15 = (long)*(int *)(*(long *)((long)pvVar7 + 0x10) + (long)local_238 * 4);
              *(float *)((long)pvVar13 + lVar15 * 4) =
                   (float)(dVar22 * (double)(float)dVar21 +
                          (double)*(float *)((long)pvVar13 + lVar15 * 4));
              local_238 = local_238 + 1;
            } while (local_238 < *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar18 * 4));
          }
          lVar15 = lVar18;
        } while (lVar18 < A->ncol);
      }
    }
    else if (0 < A->ncol) {
      lVar15 = 0;
      do {
        lVar18 = local_190;
        local_238 = *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar15 * 4);
        lVar16 = lVar15 + 1;
        fVar20 = 0.0;
        if (local_238 < *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar15 * 4)) {
          do {
            iVar4 = *(int *)(*(long *)((long)pvVar7 + 0x10) + (long)local_238 * 4);
            dVar21 = c_abs1((singlecomplex *)(lVar18 + (long)local_238 * 8));
            dVar22 = c_abs1(x + iVar4);
            fVar20 = (float)(dVar22 * dVar21 + (double)fVar20);
            local_238 = local_238 + 1;
          } while (local_238 < *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar16 * 4));
        }
        *(float *)((long)local_1c0 + lVar15 * 4) = fVar20 + *(float *)((long)local_1c0 + lVar15 * 4)
        ;
        lVar15 = lVar16;
        pvVar13 = local_1c0;
      } while (lVar16 < A->ncol);
    }
    piVar14 = local_1b0;
    pSVar10 = local_1b8;
    local_238 = 0;
    if (A->nrow < 1) {
      fVar20 = 0.0;
    }
    else {
      fVar20 = 0.0;
      do {
        lVar15 = (long)local_238;
        fVar1 = *(float *)((long)pvVar13 + lVar15 * 4);
        if (fVar1 <= fVar19) {
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            dVar21 = c_abs1(cy + lVar15);
            if ((double)fVar20 <=
                (dVar21 + local_198) / (double)*(float *)((long)pvVar13 + (long)local_238 * 4)) {
              dVar21 = c_abs1(cy + local_238);
              dVar21 = dVar21 + local_198;
              goto LAB_00104de9;
            }
          }
        }
        else {
          dVar21 = c_abs1(cy + lVar15);
          if ((double)fVar20 <= dVar21 / (double)*(float *)((long)pvVar13 + (long)local_238 * 4)) {
            dVar21 = c_abs1(cy + local_238);
LAB_00104de9:
            fVar20 = (float)(dVar21 / (double)*(float *)((long)pvVar13 + (long)local_238 * 4));
          }
        }
        local_238 = local_238 + 1;
      } while (local_238 < A->nrow);
    }
    psVar11 = local_180;
    lVar15 = local_190;
    berr[local_1d8] = fVar20;
    if (((fVar20 <= local_1e0) || (local_1cc < fVar20 + fVar20)) || (4 < local_1f0._0_4_)) break;
    cgstrs(trans,local_1a8,pSVar10,local_1a0,piVar14,&Bjcol,stat,info);
    caxpy_(&nrow,&done,cy,&ione,x,&ione);
    local_1cc = berr[local_1d8];
    local_1f0 = (double)CONCAT44(local_1f0._4_4_,local_1f0._0_4_ + 1);
  } while( true );
  stat->RefineSteps = local_1f0._0_4_;
  local_238 = 0;
  if (0 < A->nrow) {
    do {
      dVar21 = c_abs1(psVar11 + local_238);
      *(float *)((long)pvVar13 + (long)local_238 * 4) = (float)dVar21;
      local_238 = local_238 + 1;
    } while (local_238 < A->nrow);
  }
  piVar14 = local_1c8;
  if (trans == NOTRANS) {
    if (0 < A->ncol) {
      lVar16 = 0;
      do {
        dVar21 = c_abs1(x + lVar16);
        pvVar13 = local_1c0;
        local_238 = *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar16 * 4);
        lVar18 = lVar16 + 1;
        if (local_238 < *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar16 * 4)) {
          do {
            dVar22 = c_abs1((singlecomplex *)((long)local_238 * 8 + lVar15));
            lVar16 = (long)*(int *)(*(long *)((long)pvVar7 + 0x10) + (long)local_238 * 4);
            *(float *)((long)pvVar13 + lVar16 * 4) =
                 (float)(dVar22 * (double)(float)dVar21 +
                        (double)*(float *)((long)pvVar13 + lVar16 * 4));
            local_238 = local_238 + 1;
          } while (local_238 < *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar18 * 4));
        }
        lVar16 = lVar18;
        piVar14 = local_1c8;
      } while (lVar18 < A->ncol);
    }
  }
  else if (0 < A->ncol) {
    lVar16 = 0;
    do {
      local_238 = *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar16 * 4);
      lVar18 = lVar16 + 1;
      fVar20 = 0.0;
      if (local_238 < *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar16 * 4)) {
        do {
          dVar21 = c_abs1(x + *(int *)(*(long *)((long)pvVar7 + 0x10) + (long)local_238 * 4));
          dVar22 = c_abs1((singlecomplex *)((long)local_238 * 8 + lVar15));
          fVar20 = (float)((double)(float)dVar21 * dVar22 + (double)fVar20);
          local_238 = local_238 + 1;
        } while (local_238 < *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar18 * 4));
      }
      *(float *)((long)local_1c0 + lVar16 * 4) = fVar20 + *(float *)((long)local_1c0 + lVar16 * 4);
      lVar16 = lVar18;
    } while (lVar18 < A->ncol);
  }
  perm_r_00 = local_1b0;
  pSVar10 = local_1b8;
  pvVar13 = local_1c0;
  local_238 = 0;
  if (0 < A->nrow) {
    do {
      fVar20 = *(float *)((long)pvVar13 + (long)local_238 * 4);
      dVar21 = c_abs(cy + local_238);
      lVar15 = (long)local_238;
      dVar21 = (double)((float)(piVar14[lVar15] + 1) * local_1e0 *
                       *(float *)((long)pvVar13 + lVar15 * 4)) + dVar21;
      if (fVar20 <= fVar19) {
        dVar21 = dVar21 + local_198;
      }
      *(float *)((long)pvVar13 + lVar15 * 4) = (float)dVar21;
      local_238 = local_238 + 1;
    } while (local_238 < A->nrow);
  }
  kase = 0;
  est = ferr + local_1d8;
  do {
    clacon2_(&nrow,cy + A->nrow,cy,est,&kase,isave);
    if (kase == 1) {
      if (local_232 == '\0') {
        if (local_233 != 0) {
          iVar4 = A->nrow;
          if ((long)iVar4 < 1) goto LAB_001053bb;
          lVar15 = 0;
          do {
            cy[lVar15].r = cy[lVar15].r * R[lVar15];
            cy[lVar15].i = cy[lVar15].i * R[lVar15];
            lVar15 = lVar15 + 1;
          } while (iVar4 != lVar15);
          goto LAB_001053bd;
        }
      }
      else {
        iVar4 = A->ncol;
        if ((long)iVar4 < 1) {
LAB_001053bb:
          lVar15 = 0;
        }
        else {
          lVar15 = 0;
          do {
            cy[lVar15].r = cy[lVar15].r * C[lVar15];
            cy[lVar15].i = cy[lVar15].i * C[lVar15];
            lVar15 = lVar15 + 1;
          } while (iVar4 != lVar15);
        }
LAB_001053bd:
        local_238 = (int)lVar15;
      }
      cgstrs(local_1e4,local_1a8,pSVar10,local_1a0,perm_r_00,&Bjcol,stat,info);
      iVar4 = A->nrow;
      lVar15 = 0;
      if (0 < (long)iVar4) {
        do {
          cy[lVar15].r = cy[lVar15].r * *(float *)((long)pvVar13 + lVar15 * 4);
          cy[lVar15].i = cy[lVar15].i * *(float *)((long)pvVar13 + lVar15 * 4);
          lVar15 = lVar15 + 1;
        } while (iVar4 != lVar15);
      }
LAB_00105449:
      local_238 = (int)lVar15;
    }
    else {
      if (kase == 0) break;
      iVar4 = A->nrow;
      lVar15 = 0;
      if (0 < (long)iVar4) {
        do {
          cy[lVar15].r = cy[lVar15].r * *(float *)((long)pvVar13 + lVar15 * 4);
          cy[lVar15].i = cy[lVar15].i * *(float *)((long)pvVar13 + lVar15 * 4);
          lVar15 = lVar15 + 1;
        } while (iVar4 != lVar15);
      }
      local_238 = (int)lVar15;
      cgstrs(trans,local_1a8,pSVar10,local_1a0,perm_r_00,&Bjcol,stat,info);
      if (local_232 != '\0') {
        iVar4 = A->ncol;
        if ((long)iVar4 < 1) {
          lVar15 = 0;
        }
        else {
          lVar15 = 0;
          do {
            cy[lVar15].r = cy[lVar15].r * C[lVar15];
            cy[lVar15].i = cy[lVar15].i * C[lVar15];
            lVar15 = lVar15 + 1;
          } while (iVar4 != lVar15);
        }
        goto LAB_00105449;
      }
      if (local_233 != 0) {
        iVar4 = A->ncol;
        lVar15 = 0;
        if (0 < (long)iVar4) {
          do {
            cy[lVar15].r = cy[lVar15].r * R[lVar15];
            cy[lVar15].i = cy[lVar15].i * R[lVar15];
            lVar15 = lVar15 + 1;
          } while (iVar4 != lVar15);
        }
        goto LAB_00105449;
      }
    }
  } while (kase != 0);
  uVar17 = local_1d8;
  local_238 = 0;
  iVar4 = A->nrow;
  if (local_232 == '\0') {
    if (local_233 == 0) {
      if (0 < iVar4) {
        fVar20 = 0.0;
        do {
          dVar21 = c_abs1(x + local_238);
          if ((double)fVar20 <= dVar21) {
            dVar21 = c_abs1(x + local_238);
            fVar20 = (float)dVar21;
          }
          local_238 = local_238 + 1;
        } while (local_238 < A->nrow);
        goto LAB_00105653;
      }
    }
    else if (0 < iVar4) {
      fVar20 = 0.0;
      do {
        local_1f0 = (double)R[local_238];
        dVar21 = c_abs1(x + local_238);
        if ((double)fVar20 <= dVar21 * local_1f0) {
          fVar20 = R[local_238];
          dVar21 = c_abs1(x + local_238);
          fVar20 = (float)(dVar21 * (double)fVar20);
        }
        local_238 = local_238 + 1;
      } while (local_238 < A->nrow);
      goto LAB_00105653;
    }
  }
  else if (0 < iVar4) {
    fVar20 = 0.0;
    do {
      local_1f0 = (double)C[local_238];
      dVar21 = c_abs1(x + local_238);
      if ((double)fVar20 <= dVar21 * local_1f0) {
        fVar20 = C[local_238];
        dVar21 = c_abs1(x + local_238);
        fVar20 = (float)(dVar21 * (double)fVar20);
      }
      local_238 = local_238 + 1;
    } while (local_238 < A->nrow);
    goto LAB_00105653;
  }
  fVar20 = 0.0;
LAB_00105653:
  if ((fVar20 != 0.0) || (NAN(fVar20))) {
    *est = *est / fVar20;
  }
  uVar17 = uVar17 + 1;
  if (uVar17 == uVar5) goto LAB_00105684;
  goto LAB_00104ab9;
}

Assistant:

void
cgsrfs(trans_t trans, SuperMatrix *A, SuperMatrix *L, SuperMatrix *U,
       int *perm_c, int *perm_r, char *equed, float *R, float *C,
       SuperMatrix *B, SuperMatrix *X, float *ferr, float *berr,
       SuperLUStat_t *stat, int *info)
{


#define ITMAX 5
    
    /* Table of constant values */
    int    ione = 1, nrow = A->nrow;
    singlecomplex ndone = {-1., 0.};
    singlecomplex done = {1., 0.};
    
    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    SuperMatrix Bjcol;
    DNformat *Bstore, *Xstore, *Bjcol_store;
    singlecomplex   *Bmat, *Xmat, *Bptr, *Xptr;
    int      kase;
    float   safe1, safe2;
    int      i, j, k, irow, nz, count, notran, rowequ, colequ;
    int      ldb, ldx, nrhs;
    float   s, xk, lstres, eps, safmin;
    char     transc[1];
    trans_t  transt;
    singlecomplex   *work;
    float   *rwork;
    int      *iwork;
    int      isave[3];

    extern int clacon2_(int *, singlecomplex *, singlecomplex *, float *, int *, int []);

    Astore = A->Store;
    Aval   = Astore->nzval;
    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;
    
    /* Test the input parameters */
    *info = 0;
    notran = (trans == NOTRANS);
    if ( !notran && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      A->Stype != SLU_NC || A->Dtype != SLU_C || A->Mtype != SLU_GE )
	*info = -2;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
 	      L->Stype != SLU_SC || L->Dtype != SLU_C || L->Mtype != SLU_TRLU )
	*info = -3;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
 	      U->Stype != SLU_NC || U->Dtype != SLU_C || U->Mtype != SLU_TRU )
	*info = -4;
    else if ( ldb < SUPERLU_MAX(0, A->nrow) ||
 	      B->Stype != SLU_DN || B->Dtype != SLU_C || B->Mtype != SLU_GE )
        *info = -10;
    else if ( ldx < SUPERLU_MAX(0, A->nrow) ||
 	      X->Stype != SLU_DN || X->Dtype != SLU_C || X->Mtype != SLU_GE )
	*info = -11;
    if (*info != 0) {
	i = -(*info);
	input_error("cgsrfs", &i);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || nrhs == 0) {
	for (j = 0; j < nrhs; ++j) {
	    ferr[j] = 0.;
	    berr[j] = 0.;
	}
	return;
    }

    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
    
    /* Allocate working space */
    work = singlecomplexMalloc(2*A->nrow);
    rwork = (float *) SUPERLU_MALLOC( A->nrow * sizeof(float) );
    iwork = int32Malloc(A->nrow);
    if ( !work || !rwork || !iwork ) 
        ABORT("Malloc fails for work/rwork/iwork.");
    
    if ( notran ) {
	*(unsigned char *)transc = 'N';
        transt = TRANS;
    } else if ( trans == TRANS ) {
	*(unsigned char *)transc = 'T';
	transt = NOTRANS;
    } else if ( trans == CONJ ) {
	*(unsigned char *)transc = 'C';
	transt = NOTRANS;
    }    

    /* NZ = maximum number of nonzero elements in each row of A, plus 1 */
    nz     = A->ncol + 1;
    eps    = smach("Epsilon");
    safmin = smach("Safe minimum");

    /* Set SAFE1 essentially to be the underflow threshold times the
       number of additions in each row. */
    safe1  = nz * safmin;
    safe2  = safe1 / eps;

    /* Compute the number of nonzeros in each row (or column) of A */
    for (i = 0; i < A->nrow; ++i) iwork[i] = 0;
    if ( notran ) {
	for (k = 0; k < A->ncol; ++k)
	    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) 
		++iwork[Astore->rowind[i]];
    } else {
	for (k = 0; k < A->ncol; ++k)
	    iwork[k] = Astore->colptr[k+1] - Astore->colptr[k];
    }	

    /* Copy one column of RHS B into Bjcol. */
    Bjcol.Stype = B->Stype;
    Bjcol.Dtype = B->Dtype;
    Bjcol.Mtype = B->Mtype;
    Bjcol.nrow  = B->nrow;
    Bjcol.ncol  = 1;
    Bjcol.Store = (void *) SUPERLU_MALLOC( sizeof(DNformat) );
    if ( !Bjcol.Store ) ABORT("SUPERLU_MALLOC fails for Bjcol.Store");
    Bjcol_store = Bjcol.Store;
    Bjcol_store->lda = ldb;
    Bjcol_store->nzval = work; /* address aliasing */
	
    /* Do for each right hand side ... */
    for (j = 0; j < nrhs; ++j) {
	count = 0;
	lstres = 3.;
	Bptr = &Bmat[j*ldb];
	Xptr = &Xmat[j*ldx];

	while (1) { /* Loop until stopping criterion is satisfied. */

	    /* Compute residual R = B - op(A) * X,   
	       where op(A) = A, A**T, or A**H, depending on TRANS. */
	    
#ifdef _CRAY
	    CCOPY(&nrow, Bptr, &ione, work, &ione);
#else
	    ccopy_(&nrow, Bptr, &ione, work, &ione);
#endif
	    sp_cgemv(transc, ndone, A, Xptr, ione, done, work, ione);

	    /* Compute componentwise relative backward error from formula 
	       max(i) ( abs(R(i)) / ( abs(op(A))*abs(X) + abs(B) )(i) )   
	       where abs(Z) is the componentwise absolute value of the matrix
	       or vector Z.  If the i-th component of the denominator is less
	       than SAFE2, then SAFE1 is added to the i-th component of the   
	       numerator before dividing. */

	    for (i = 0; i < A->nrow; ++i) rwork[i] = c_abs1( &Bptr[i] );
	    
	    /* Compute abs(op(A))*abs(X) + abs(B). */
	    if ( notran ) {
		for (k = 0; k < A->ncol; ++k) {
		    xk = c_abs1( &Xptr[k] );
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
			rwork[Astore->rowind[i]] += c_abs1(&Aval[i]) * xk;
		}
	    } else {  /* trans = TRANS or CONJ */
		for (k = 0; k < A->ncol; ++k) {
		    s = 0.;
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
			irow = Astore->rowind[i];
			s += c_abs1(&Aval[i]) * c_abs1(&Xptr[irow]);
		    }
		    rwork[k] += s;
		}
	    }
	    s = 0.;
	    for (i = 0; i < A->nrow; ++i) {
		if (rwork[i] > safe2) {
		    s = SUPERLU_MAX( s, c_abs1(&work[i]) / rwork[i] );
                } else if ( rwork[i] != 0.0 ) {
		    s = SUPERLU_MAX( s, (c_abs1(&work[i]) + safe1) / rwork[i] );
                }
                /* If rwork[i] is exactly 0.0, then we know the true 
                   residual also must be exactly 0.0. */
	    }
	    berr[j] = s;

	    /* Test stopping criterion. Continue iterating if   
	       1) The residual BERR(J) is larger than machine epsilon, and   
	       2) BERR(J) decreased by at least a factor of 2 during the   
	          last iteration, and   
	       3) At most ITMAX iterations tried. */

	    if (berr[j] > eps && berr[j] * 2. <= lstres && count < ITMAX) {
		/* Update solution and try again. */
		cgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
#ifdef _CRAY
		CAXPY(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#else
		caxpy_(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#endif
		lstres = berr[j];
		++count;
	    } else {
		break;
	    }
        
	} /* end while */

	stat->RefineSteps = count;

	/* Bound error from formula:
	   norm(X - XTRUE) / norm(X) .le. FERR = norm( abs(inv(op(A)))*   
	   ( abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) / norm(X)   
          where   
            norm(Z) is the magnitude of the largest component of Z   
            inv(op(A)) is the inverse of op(A)   
            abs(Z) is the componentwise absolute value of the matrix or
	       vector Z   
            NZ is the maximum number of nonzeros in any row of A, plus 1   
            EPS is machine epsilon   

          The i-th component of abs(R)+NZ*EPS*(abs(op(A))*abs(X)+abs(B))   
          is incremented by SAFE1 if the i-th component of   
          abs(op(A))*abs(X) + abs(B) is less than SAFE2.   

          Use CLACON2 to estimate the infinity-norm of the matrix   
             inv(op(A)) * diag(W),   
          where W = abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) */
	
	for (i = 0; i < A->nrow; ++i) rwork[i] = c_abs1( &Bptr[i] );
	
	/* Compute abs(op(A))*abs(X) + abs(B). */
	if ( notran ) {
	    for (k = 0; k < A->ncol; ++k) {
		xk = c_abs1( &Xptr[k] );
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
		    rwork[Astore->rowind[i]] += c_abs1(&Aval[i]) * xk;
	    }
	} else {  /* trans == TRANS or CONJ */
	    for (k = 0; k < A->ncol; ++k) {
		s = 0.;
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
		    irow = Astore->rowind[i];
		    xk = c_abs1( &Xptr[irow] );
		    s += c_abs1(&Aval[i]) * xk;
		}
		rwork[k] += s;
	    }
	}
	
	for (i = 0; i < A->nrow; ++i)
	    if (rwork[i] > safe2)
		rwork[i] = c_abs(&work[i]) + (iwork[i]+1)*eps*rwork[i];
	    else
		rwork[i] = c_abs(&work[i])+(iwork[i]+1)*eps*rwork[i]+safe1;
	kase = 0;

	do {
	    clacon2_(&nrow, &work[A->nrow], work, &ferr[j], &kase, isave);
	    if (kase == 0) break;

	    if (kase == 1) {
		/* Multiply by diag(W)*inv(op(A)**T)*(diag(C) or diag(R)). */
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        cs_mult(&work[i], &work[i], C[i]);
	            }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->nrow; ++i) {
		        cs_mult(&work[i], &work[i], R[i]);
                    }

		cgstrs (transt, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		for (i = 0; i < A->nrow; ++i) {
		    cs_mult(&work[i], &work[i], rwork[i]);
	 	}
	    } else {
		/* Multiply by (diag(C) or diag(R))*inv(op(A))*diag(W). */
		for (i = 0; i < A->nrow; ++i) {
		    cs_mult(&work[i], &work[i], rwork[i]);
		}
		
		cgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        cs_mult(&work[i], &work[i], C[i]);
		    }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->ncol; ++i) {
		        cs_mult(&work[i], &work[i], R[i]);  
		    }
	    }
	    
	} while ( kase != 0 );

	/* Normalize error. */
	lstres = 0.;
 	if ( notran && colequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, C[i] * c_abs1( &Xptr[i]) );
  	} else if ( !notran && rowequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, R[i] * c_abs1( &Xptr[i]) );
	} else {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, c_abs1( &Xptr[i]) );
	}
	if ( lstres != 0. )
	    ferr[j] /= lstres;

    } /* for each RHS j ... */
    
    SUPERLU_FREE(work);
    SUPERLU_FREE(rwork);
    SUPERLU_FREE(iwork);
    SUPERLU_FREE(Bjcol.Store);

    return;

}